

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  long lVar5;
  ulong uVar6;
  reference pvVar7;
  cmGlobalGenerator *gg;
  string *psVar8;
  ostream *poVar9;
  char *pcVar10;
  FILE *__stream;
  size_t sVar11;
  bool collapse;
  size_t *local_11d8;
  char *c;
  size_t n;
  char buffer [4096];
  int bufferSize;
  FILE *fin;
  undefined1 local_1b0 [4];
  int res;
  undefined1 local_190 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  cmWorkingDirectory workdir;
  string outFile;
  string inFile;
  string modulesPath;
  cmGlobalGenerator *gen;
  string value;
  string *arg;
  uint i;
  undefined1 local_90 [3];
  bool writeToStdout;
  string destPath;
  undefined1 local_60 [8];
  string cwd;
  string resultFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  std::__cxx11::string::string((string *)(cwd.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_60,(SystemTools *)0x1,collapse);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "/__cmake_systeminformation");
  cmsys::SystemTools::RemoveADirectory((string *)local_90);
  bVar1 = cmsys::SystemTools::MakeDirectory((string *)local_90,(mode_t *)0x0);
  if (bVar1) {
    bVar1 = true;
    for (arg._4_4_ = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args), arg._4_4_ < sVar4; arg._4_4_ = arg._4_4_ + 1) {
      value.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,(ulong)arg._4_4_);
      lVar5 = std::__cxx11::string::find((char *)value.field_2._8_8_,0x7cd582);
      if (lVar5 == 0) {
        std::__cxx11::string::substr((ulong)&gen,value.field_2._8_8_);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
LAB_002eaa9e:
          gg = CreateGlobalGenerator(this,(string *)&gen);
          if (gg == (cmGlobalGenerator *)0x0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&modulesPath.field_2 + 8),"Could not create named generator ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen
                          );
            cmSystemTools::Error((string *)((long)&modulesPath.field_2 + 8));
            std::__cxx11::string::~string((string *)(modulesPath.field_2._M_local_buf + 8));
            PrintGeneratorList(this);
          }
          else {
            SetGlobalGenerator(this,gg);
          }
          bVar2 = false;
        }
        else {
          arg._4_4_ = arg._4_4_ + 1;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (arg._4_4_ < sVar4) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)arg._4_4_);
            std::__cxx11::string::operator=((string *)&gen,(string *)pvVar7);
            goto LAB_002eaa9e;
          }
          cmSystemTools::Error("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
          PrintGeneratorList(this);
          this_local._4_4_ = -1;
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)&gen);
        if (bVar2) goto LAB_002eb184;
      }
      else {
        bVar1 = cmsys::SystemTools::FileIsFullPath((string *)value.field_2._8_8_);
        if (!bVar1) {
          std::__cxx11::string::operator=
                    ((string *)(cwd.field_2._M_local_buf + 8),(string *)local_60);
          std::__cxx11::string::operator+=((string *)(cwd.field_2._M_local_buf + 8),"/");
        }
        std::__cxx11::string::operator+=
                  ((string *)(cwd.field_2._M_local_buf + 8),(string *)value.field_2._8_8_);
        bVar1 = false;
      }
    }
    AddCMakePaths(this);
    psVar8 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::__cxx11::string::string((string *)(inFile.field_2._M_local_buf + 8),(string *)psVar8);
    std::__cxx11::string::operator+=((string *)(inFile.field_2._M_local_buf + 8),"/Modules");
    std::__cxx11::string::string
              ((string *)(outFile.field_2._M_local_buf + 8),
               (string *)(inFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(outFile.field_2._M_local_buf + 8),"/SystemInformation.cmake");
    std::__cxx11::string::string((string *)&workdir.ResultCode,(string *)local_90);
    std::__cxx11::string::operator+=((string *)&workdir.ResultCode,"/CMakeLists.txt");
    bVar2 = cmsys::SystemTools::CopyFileAlways
                      ((string *)((long)&outFile.field_2 + 8),(string *)&workdir.ResultCode);
    if (bVar2) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        std::__cxx11::string::operator=((string *)(cwd.field_2._M_local_buf + 8),(string *)local_60)
        ;
        std::__cxx11::string::operator+=
                  ((string *)(cwd.field_2._M_local_buf + 8),"/__cmake_systeminformation/results.txt"
                  );
      }
      cmWorkingDirectory::cmWorkingDirectory
                ((cmWorkingDirectory *)
                 &args2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_90);
      bVar2 = cmWorkingDirectory::Failed
                        ((cmWorkingDirectory *)
                         &args2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to change to directory ");
        poVar9 = std::operator<<(poVar9,(string *)local_90);
        poVar9 = std::operator<<(poVar9," : ");
        iVar3 = cmWorkingDirectory::GetLastResult
                          ((cmWorkingDirectory *)
                           &args2.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar10 = strerror(iVar3);
        poVar9 = std::operator<<(poVar9,pcVar10);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 1;
        bVar2 = true;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_190);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_190,pvVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_190,(value_type *)local_90);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,"-DRESULT_FILE=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cwd.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_190,(value_type *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        iVar3 = Run(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_190,false);
        bVar2 = iVar3 != 0;
        if (bVar2) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: --system-information failed on internal CMake!\n");
          this_local._4_4_ = iVar3;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_190);
      }
      cmWorkingDirectory::~cmWorkingDirectory
                ((cmWorkingDirectory *)
                 &args2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) {
        if ((bVar1) &&
           (__stream = (FILE *)cmsys::SystemTools::Fopen((string *)((long)&cwd.field_2 + 8),"r"),
           __stream != (FILE *)0x0)) {
          buffer[0xffc] = '\0';
          buffer[0xffd] = '\x10';
          buffer[0xffe] = '\0';
          buffer[0xfff] = '\0';
          while (sVar11 = fread(&n,1,0x1000,__stream), sVar11 != 0) {
            for (local_11d8 = &n; local_11d8 < buffer + (sVar11 - 8);
                local_11d8 = (size_t *)((long)local_11d8 + 1)) {
              putc((int)(char)*local_11d8,_stdout);
            }
            fflush(_stdout);
          }
          fclose(__stream);
        }
        cmsys::SystemTools::RemoveADirectory((string *)local_90);
        this_local._4_4_ = 0;
      }
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Error copying file \"");
      poVar9 = std::operator<<(poVar9,(string *)(outFile.field_2._M_local_buf + 8));
      poVar9 = std::operator<<(poVar9,"\" to \"");
      poVar9 = std::operator<<(poVar9,(string *)&workdir.ResultCode);
      std::operator<<(poVar9,"\".\n");
      this_local._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&workdir.ResultCode);
    std::__cxx11::string::~string((string *)(outFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(inFile.field_2._M_local_buf + 8));
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Error: --system-information must be run from a writable directory!\n");
    this_local._4_4_ = 1;
  }
LAB_002eb184:
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(cwd.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath)) {
    std::cerr << "Error: --system-information must be run from a "
                 "writable directory!\n";
    return 1;
  }

  // process the arguments
  bool writeToStdout = true;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator " + value);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the output file
    else {
      if (!cmSystemTools::FileIsFullPath(arg)) {
        resultFile = cwd;
        resultFile += "/";
      }
      resultFile += arg;
      writeToStdout = false;
    }
  }

  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath = cmSystemTools::GetCMakeRoot();
  modulesPath += "/Modules";
  std::string inFile = modulesPath;
  inFile += "/SystemInformation.cmake";
  std::string outFile = destPath;
  outFile += "/CMakeLists.txt";

  // Copy file
  if (!cmsys::SystemTools::CopyFileAlways(inFile, outFile)) {
    std::cerr << "Error copying file \"" << inFile << "\" to \"" << outFile
              << "\".\n";
    return 1;
  }

  // do we write to a file or to stdout?
  if (resultFile.empty()) {
    resultFile = cwd;
    resultFile += "/__cmake_systeminformation/results.txt";
  }

  {
    // now run cmake on the CMakeLists file
    cmWorkingDirectory workdir(destPath);
    if (workdir.Failed()) {
      // We created the directory and we were able to copy the CMakeLists.txt
      // file to it, so we wouldn't expect to get here unless the default
      // permissions are questionable or some other process has deleted the
      // directory
      std::cerr << "Failed to change to directory " << destPath << " : "
                << std::strerror(workdir.GetLastResult()) << std::endl;
      return 1;
    }
    std::vector<std::string> args2;
    args2.push_back(args[0]);
    args2.push_back(destPath);
    args2.push_back("-DRESULT_FILE=" + resultFile);
    int res = this->Run(args2, false);

    if (res != 0) {
      std::cerr << "Error: --system-information failed on internal CMake!\n";
      return res;
    }
  }

  // echo results to stdout if needed
  if (writeToStdout) {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if (fin) {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while ((n = fread(buffer, 1, bufferSize, fin)) > 0) {
        for (char* c = buffer; c < buffer + n; ++c) {
          putc(*c, stdout);
        }
        fflush(stdout);
      }
      fclose(fin);
    }
  }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}